

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_New_Memory_Face(FT_Library library,FT_Byte *file_base,FT_Long file_size,
                           FT_Long face_index,FT_Face_conflict *aface)

{
  FT_Error FVar1;
  undefined1 local_48 [8];
  FT_Open_Args args;
  
  if (file_base != (FT_Byte *)0x0) {
    local_48._0_4_ = 1;
    args.pathname = (FT_String *)0x0;
    args._0_8_ = file_base;
    args.memory_base = (FT_Byte *)file_size;
    FVar1 = ft_open_face_internal(library,(FT_Open_Args *)local_48,face_index,aface,'\x01');
    return FVar1;
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Memory_Face( FT_Library      library,
                      const FT_Byte*  file_base,
                      FT_Long         file_size,
                      FT_Long         face_index,
                      FT_Face        *aface )
  {
    FT_Open_Args  args;


    /* test for valid `library' and `face' delayed to `FT_Open_Face' */
    if ( !file_base )
      return FT_THROW( Invalid_Argument );

    args.flags       = FT_OPEN_MEMORY;
    args.memory_base = file_base;
    args.memory_size = file_size;
    args.stream      = NULL;

    return ft_open_face_internal( library, &args, face_index, aface, 1 );
  }